

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_basic.hpp
# Opt level: O0

void __thiscall lest::failure::failure(failure *this,location *where_,text *expr_)

{
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [32];
  location local_80;
  allocator local_41;
  string local_40 [32];
  text *local_20;
  text *expr__local;
  location *where__local;
  failure *this_local;
  
  local_20 = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"failed",&local_41);
  location::location(&local_80,where_);
  std::__cxx11::string::string(local_a0,(string *)expr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",&local_c1);
  message::message(&this->super_message,(text *)local_40,&local_80,(text *)local_a0,(text *)local_c0
                  );
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_a0);
  location::~location(&local_80);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(undefined ***)&this->super_message = &PTR__failure_0010ac50;
  return;
}

Assistant:

failure( location where_, text expr_)
    : message{ "failed", where_, expr_} {}